

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_transform_data.h
# Opt level: O3

void __thiscall
draco::AttributeTransformData::AppendParameterValue<float>
          (AttributeTransformData *this,float *in_data)

{
  ulong size;
  pointer puVar1;
  ulong uVar2;
  long lVar3;
  
  puVar1 = (this->buffer_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(this->buffer_).data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  lVar3 = (long)(int)uVar2;
  size = lVar3 + 4;
  if (uVar2 < size) {
    DataBuffer::Resize(&this->buffer_,size);
    puVar1 = (this->buffer_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  *(float *)(puVar1 + lVar3) = *in_data;
  return;
}

Assistant:

void AppendParameterValue(const DataTypeT &in_data) {
    SetParameterValue(static_cast<int>(buffer_.data_size()), in_data);
  }